

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O0

void Abc_NtkPrecomputeCellPairsTest(void)

{
  uint uVar1;
  int iVar2;
  Mio_Cell2_t *pCells_00;
  Vec_Int_t *vInfo_00;
  Vec_Int_t *p;
  Vec_Int_t *vFirst;
  int nRecUsed;
  Vec_Int_t *vInfo;
  Mio_Cell2_t *pCells;
  int nCells;
  
  pCells_00 = Mio_CollectRootsNewDefault2(6,(int *)((long)&pCells + 4),0);
  vInfo_00 = Abc_NtkPrecomputeCellPairs(pCells_00,pCells._4_4_);
  uVar1 = Abc_NtkPrecomputePrint(pCells_00,pCells._4_4_,vInfo_00);
  p = Abc_NtkPrecomputeFirsts(pCells_00,pCells._4_4_);
  iVar2 = Vec_IntSize(vInfo_00);
  printf("Used records = %d.  All records = %d.\n",(ulong)uVar1,(ulong)(iVar2 / 3 - uVar1));
  iVar2 = Vec_IntSize(p);
  if (pCells._4_4_ != iVar2) {
    __assert_fail("nCells == Vec_IntSize(vFirst)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmArea.c"
                  ,0xac,"void Abc_NtkPrecomputeCellPairsTest()");
  }
  Vec_IntFree(p);
  Vec_IntFree(vInfo_00);
  if (pCells_00 != (Mio_Cell2_t *)0x0) {
    free(pCells_00);
  }
  return;
}

Assistant:

void Abc_NtkPrecomputeCellPairsTest()
{
    int nCells;
    Mio_Cell2_t * pCells = Mio_CollectRootsNewDefault2( 6, &nCells, 0 );
    Vec_Int_t * vInfo = Abc_NtkPrecomputeCellPairs( pCells, nCells );
    int nRecUsed = Abc_NtkPrecomputePrint( pCells, nCells, vInfo );
    // iterate through the cells
    Vec_Int_t * vFirst = Abc_NtkPrecomputeFirsts( pCells, nCells );
    printf( "Used records = %d.  All records = %d.\n", nRecUsed, Vec_IntSize(vInfo)/3 - nRecUsed );
    assert( nCells == Vec_IntSize(vFirst) );
    Vec_IntFree( vFirst );
    Vec_IntFree( vInfo );
    ABC_FREE( pCells );
}